

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O1

void __thiscall
GraphicBoard::createTilesFromImage
          (GraphicBoard *this,QImage *sourceImage,BoardSize boardSize,size_t tileSize,
          GraphicMode graphicMode)

{
  size_t boardSize_00;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  TileSize TVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  int iVar7;
  long lVar8;
  QImage boardImage;
  QImage local_80 [16];
  undefined8 local_70;
  BoardSize local_64;
  QRect local_60;
  undefined8 local_50;
  undefined *local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  
  local_64 = boardSize;
  pmVar5 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_64);
  boardSize_00 = *pmVar5;
  lVar8 = boardSize_00 * tileSize;
  QImage::QImage(local_80);
  iVar7 = (int)lVar8;
  if (graphicMode == SCALED) {
    local_48 = (undefined *)CONCAT44(iVar7,iVar7);
    QImage::scaled((QSize *)&local_60,(AspectRatioMode)sourceImage,(TransformationMode)&local_48);
  }
  else {
    iVar2 = QImage::width();
    iVar3 = QImage::height();
    iVar2 = (int)((ulong)(iVar2 - lVar8) >> 1);
    local_3c = (int)((ulong)(iVar3 - lVar8) >> 1);
    local_48 = (undefined *)CONCAT44(local_3c,iVar2);
    local_40 = iVar2 + iVar7 + -1;
    local_3c = iVar7 + -1 + local_3c;
    QImage::copy(&local_60);
  }
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
  uVar1 = local_50;
  local_38 = local_70;
  local_48 = &char_const*::typeinfo;
  local_50 = 0;
  local_70 = uVar1;
  QImage::~QImage((QImage *)&local_48);
  QImage::~QImage((QImage *)&local_60);
  createTiles(this,local_80,boardSize_00,tileSize);
  TVar4 = Maps::getTileSizeByInt(tileSize);
  this->tileSize = TVar4;
  pmVar6 = std::
           map<TileSize,_FontSize,_std::less<TileSize>,_std::allocator<std::pair<const_TileSize,_FontSize>_>_>
           ::at(&Maps::tileSizeFontSize,&this->tileSize);
  this->fontSize = *pmVar6;
  QImage::~QImage(local_80);
  return;
}

Assistant:

void GraphicBoard::createTilesFromImage( QImage& sourceImage, BoardSize boardSize, size_t tileSize, GraphicMode graphicMode )
{
    size_t boardSizeInt = Maps::boardSizeInt.at( boardSize );
    size_t boardSizePixel = boardSizeInt * tileSize;

    QImage boardImage;
    if ( graphicMode == GraphicMode::SCALED )
    {
        boardImage = sourceImage.scaled( boardSizePixel, boardSizePixel );
    }
    else
    {
        boardImage = sourceImage.copy(( sourceImage.width() - boardSizePixel ) / 2,
                                      ( sourceImage.height() - boardSizePixel ) / 2,
                                        boardSizePixel,
                                        boardSizePixel );
    }

    createTiles( boardImage, boardSizeInt, tileSize );
    this->tileSize = Maps::getTileSizeByInt( tileSize );
    this->fontSize = Maps::tileSizeFontSize.at( this->tileSize );
}